

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void do_fmlal_idx(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  uint uVar1;
  float32 xb;
  float32 fVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar8;
  float32 *pfVar9;
  uintptr_t i;
  ulong uVar7;
  
  uVar1 = desc * 8 & 0xff;
  uVar6 = uVar1 + 8;
  uVar7 = (ulong)uVar6;
  uVar4 = desc >> 0xb;
  uVar6 = (uint)(uVar6 == 0x10);
  uVar5 = *(ulong *)((long)vn + (ulong)(uVar4 & uVar6) * 8) >> (sbyte)((~uVar6 & uVar4 & 1) << 5);
  uVar3 = uVar5 ^ 0x8000800080008000;
  if ((desc >> 10 & 1) == 0) {
    uVar3 = uVar5;
  }
  xb = float16_to_float32_by_bits((uint)*(ushort *)((long)vm + (ulong)(uVar4 & 0xe)),fz16);
  lVar8 = 0;
  pfVar9 = d;
  do {
    fVar2 = float16_to_float32_by_bits((uint32_t)(uVar3 >> ((byte)lVar8 & 0x3f)),fz16);
    fVar2 = float32_muladd_aarch64(fVar2,xb,*pfVar9,0,fpst);
    *pfVar9 = fVar2;
    lVar8 = lVar8 + 0x10;
    pfVar9 = pfVar9 + 1;
  } while ((ulong)((desc & 0x1f) << 5) + 0x20 != lVar8);
  uVar4 = desc >> 2 & 0xf8;
  if (uVar1 < uVar4) {
    uVar5 = (ulong)(uVar4 + 8);
    uVar3 = uVar7 + 8;
    if (uVar7 + 8 < uVar5) {
      uVar3 = uVar5;
    }
    memset((void *)((long)d + uVar7),0,(~uVar7 + uVar3 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

static void do_fmlal_idx(float32 *d, void *vn, void *vm, float_status *fpst,
                         uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int index = extract32(desc, SIMD_DATA_SHIFT + 2, 3);
    int is_q = oprsz == 16;
    uint64_t n_4;
    float32 m_1;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    m_1 = float16_to_float32_by_bits(((float16 *)vm)[H2(index)], fz16);

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}